

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_lambda(char *fn,float32 min,float32 max)

{
  int iVar1;
  uint local_30;
  uint local_2c;
  uint32 i;
  uint32 n_lmb;
  float32 *lmb;
  float32 max_local;
  float32 min_local;
  char *fn_local;
  
  lmb._0_4_ = max;
  lmb._4_4_ = min;
  _max_local = fn;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x73,"Reading %s\n",fn);
  iVar1 = s3lamb_read(_max_local,(float32 **)&i,&local_2c);
  if (iVar1 == 0) {
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      if (((float)lmb._4_4_ <= (float)_i[local_30]) && ((float)_i[local_30] <= (float)lmb._0_4_)) {
        printf("%u: %0.4f\n",(double)(float)_i[local_30],(ulong)local_30);
      }
    }
    fn_local._4_4_ = 0;
  }
  else {
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int
print_lambda(const char *fn, float32 min, float32 max)
{
    float32 *lmb;
    uint32 n_lmb;
    uint32 i;

    E_INFO("Reading %s\n",  fn);

    if (s3lamb_read(fn, &lmb, &n_lmb) != S3_SUCCESS)
	return S3_ERROR;

    for (i = 0; i < n_lmb; i++) {
	if ((lmb[i] >= min) && (lmb[i] <= max))
	    printf("%u: %0.4f\n", i, lmb[i]);
    }

    return S3_SUCCESS;
}